

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  ostream *poVar1;
  
  if ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.used == true) {
    printSummaryDivider(this);
    poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Summary for group \'");
    poVar1 = std::operator<<(poVar1,(string *)&_testGroupStats->groupInfo);
    std::operator<<(poVar1,"\':\n");
    printTotals(this,&_testGroupStats->totals);
    poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n'
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  LazyStat<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo);
  return;
}

Assistant:

void ConsoleReporter::testGroupEnded(TestGroupStats const &_testGroupStats) {
    if (currentGroupInfo.used) {
      printSummaryDivider();
      stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
      printTotals(_testGroupStats.totals);
      stream << '\n'
             << std::endl;
    }
    StreamingReporterBase::testGroupEnded(_testGroupStats);
  }